

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnAtomicRmwCmpxchgExpr
          (BinaryReaderIR *this,Opcode opcode,Index memidx,Address alignment_log2,Address offset)

{
  Result RVar1;
  Expr *local_c0;
  Address offset_local;
  Opcode opcode_local;
  unsigned_long local_a8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_a0;
  Location local_98;
  Var local_78;
  
  offset_local = offset;
  opcode_local = opcode;
  GetLocation(&local_98,this);
  Var::Var(&local_78,memidx,&local_98);
  local_a8 = 1L << ((byte)alignment_log2 & 0x3f);
  std::
  make_unique<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Opcode&,wabt::Var,unsigned_long_long,unsigned_long&>
            ((Opcode *)&local_c0,(Var *)&opcode_local,(unsigned_long_long *)&local_78,&local_a8);
  local_a0._M_head_impl = local_c0;
  local_c0 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_a0);
  if (local_a0._M_head_impl != (Expr *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_c0 != (Expr *)0x0) {
    (**(code **)(*(long *)local_c0 + 8))();
  }
  local_c0 = (Expr *)0x0;
  Var::~Var(&local_78);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnAtomicRmwCmpxchgExpr(Opcode opcode,
                                              Index memidx,
                                              Address alignment_log2,
                                              Address offset) {
  return AppendExpr(std::make_unique<AtomicRmwCmpxchgExpr>(
      opcode, Var(memidx, GetLocation()), 1ull << alignment_log2, offset));
}